

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall
helics::ActionMessage::ActionMessage(ActionMessage *this,vector<char,_std::allocator<char>_> *bytes)

{
  ActionMessage *in_RSI;
  vector<char,_std::allocator<char>_> *unaff_retaddr;
  ActionMessage *in_stack_00000008;
  
  ActionMessage(in_RSI);
  from_vector(in_stack_00000008,unaff_retaddr);
  return;
}

Assistant:

ActionMessage::ActionMessage(const std::vector<char>& bytes): ActionMessage()
{
    from_vector(bytes);
}